

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall
VertexClustering::pushNeighbors
          (VertexClustering *this,VCFace *f,VCEdge *e,
          queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *q)

{
  bool bVar1;
  mapped_type *pmVar2;
  map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_> *this_00;
  VCEdge *pVVar3;
  VCEdge e2;
  VCEdge e1;
  VCEdge e3;
  VCEdge local_78;
  VCEdge local_68;
  key_type local_50;
  value_type local_48;
  
  this_00 = &this->edgeMap;
  local_78.f1 = *(VCFace **)f;
  pmVar2 = std::
           map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::
           operator[](this_00,(key_type *)&local_78);
  local_68.f1 = pmVar2->f1;
  local_68.f2 = pmVar2->f2;
  local_48.f1 = (VCFace *)CONCAT44(f->v3,f->v1);
  pmVar2 = std::
           map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::
           operator[](this_00,(key_type *)&local_48);
  local_78.f1 = pmVar2->f1;
  local_78.f2 = pmVar2->f2;
  local_50.a = f->v2;
  local_50.b = f->v3;
  pmVar2 = std::
           map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::
           operator[](this_00,&local_50);
  local_48.f1 = pmVar2->f1;
  local_48.f2 = pmVar2->f2;
  bVar1 = VCEdge::operator==(&local_68,e);
  pVVar3 = &local_48;
  if (bVar1) {
    std::deque<VCEdge,_std::allocator<VCEdge>_>::push_back(&q->c,&local_78);
  }
  else {
    bVar1 = VCEdge::operator==(&local_78,e);
    std::deque<VCEdge,_std::allocator<VCEdge>_>::push_back(&q->c,&local_68);
    if (!bVar1) {
      pVVar3 = &local_78;
    }
  }
  std::deque<VCEdge,_std::allocator<VCEdge>_>::push_back(&q->c,pVVar3);
  return;
}

Assistant:

void VertexClustering::pushNeighbors(VCFace *f, VCEdge& e, queue<VCEdge>* q)
{
	VCEdge e1(edgeMap[VCPair(f->v1, f->v2)]);
	VCEdge e2(edgeMap[VCPair(f->v1, f->v3)]);
	VCEdge e3(edgeMap[VCPair(f->v2, f->v3)]);
	if (e1 == e) {
		q->push(e2);
		q->push(e3);
	}
	else if (e2 == e) {
		q->push(e1);
		q->push(e3);
	}
	else {
		q->push(e1);
		q->push(e2);
	}
}